

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

rule * Rule_merge(rule *pA,rule *pB)

{
  rule *prVar1;
  rule *prVar2;
  rule *prVar3;
  rule **local_28;
  rule **ppPrev;
  rule *pFirst;
  rule *pB_local;
  rule *pA_local;
  
  ppPrev = (rule **)0x0;
  local_28 = (rule **)&ppPrev;
  pFirst = pB;
  pB_local = pA;
  while (pB_local != (rule *)0x0 && pFirst != (rule *)0x0) {
    if (pB_local->iRule < pFirst->iRule) {
      *local_28 = pB_local;
      prVar2 = pFirst;
      prVar3 = pB_local->next;
      prVar1 = pB_local;
    }
    else {
      *local_28 = pFirst;
      prVar2 = pFirst->next;
      prVar3 = pB_local;
      prVar1 = pFirst;
    }
    pB_local = prVar3;
    pFirst = prVar2;
    local_28 = &prVar1->next;
  }
  if (pB_local == (rule *)0x0) {
    *local_28 = pFirst;
  }
  else {
    *local_28 = pB_local;
  }
  return (rule *)ppPrev;
}

Assistant:

static struct rule *Rule_merge(struct rule *pA, struct rule *pB){
  struct rule *pFirst = 0;
  struct rule **ppPrev = &pFirst;
  while( pA && pB ){
    if( pA->iRule<pB->iRule ){
      *ppPrev = pA;
      ppPrev = &pA->next;
      pA = pA->next;
    }else{
      *ppPrev = pB;
      ppPrev = &pB->next;
      pB = pB->next;
    }
  }
  if( pA ){
    *ppPrev = pA;
  }else{
    *ppPrev = pB;
  }
  return pFirst;
}